

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

FieldInfo __thiscall QDateTimeParser::fieldInfo(QDateTimeParser *this,int index)

{
  Section SVar1;
  QFlags<QDateTimeParser::FieldInfoFlag> other;
  SectionNode *pSVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  ushort *puVar5;
  uint in_ESI;
  long in_FS_OFFSET;
  SectionNode *sn;
  FieldInfo ret;
  SectionNode *in_stack_fffffffffffffef8;
  enum_type in_stack_ffffffffffffff00;
  enum_type in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QMessageLogger *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  QDateTimeParser *in_stack_ffffffffffffff20;
  QString *s;
  undefined8 in_stack_ffffffffffffff28;
  QDateTimeParser *in_stack_ffffffffffffff30;
  QString local_78;
  QMessageLogger local_60;
  QString local_40;
  QString local_28;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> local_c;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<QDateTimeParser::FieldInfoFlag>::QFlags((QFlags<QDateTimeParser::FieldInfoFlag> *)0x76e900)
  ;
  pSVar2 = sectionNode(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  SVar1 = pSVar2->type;
  if (SVar1 == AmPmSection) {
    getAmPmText(in_stack_ffffffffffffff30,(AmPm)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                (Case)in_stack_ffffffffffffff28);
    qVar3 = QString::size(&local_28);
    getAmPmText(in_stack_ffffffffffffff30,(AmPm)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                (Case)in_stack_ffffffffffffff28);
    qVar4 = QString::size(&local_40);
    QString::~QString((QString *)0x76eb39);
    QString::~QString((QString *)0x76eb46);
    if (qVar3 == qVar4) {
      QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
                ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,FixedWidth);
    }
    goto LAB_0076ec49;
  }
  if (SVar1 == MSecSection) {
    QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
              ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,Fraction);
LAB_0076ea08:
    QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
              ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,AllowPartial);
  }
  else {
    if ((((SVar1 == SecondSection) || (SVar1 == MinuteSection)) || (SVar1 == Hour12Section)) ||
       (SVar1 == Hour24Section)) goto LAB_0076ea08;
    if (SVar1 == TimeZoneSection) goto LAB_0076ec49;
    if ((SVar1 == DaySection) || (SVar1 == MonthSection)) {
      if (pSVar2->count != 1) {
        if (pSVar2->count != 2) goto LAB_0076ec49;
        QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
                  ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,FixedWidth);
      }
      other = ::operator|(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
                ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,other);
      goto LAB_0076ec49;
    }
    if (SVar1 != YearSection) {
      if (SVar1 != YearSection2Digits) {
        if ((SVar1 == DayOfWeekSectionShort) || (SVar1 == DayOfWeekSectionLong)) {
          if (pSVar2->count == 3) {
            QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
                      ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,FixedWidth);
          }
        }
        else {
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff10,
                     (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff04,(char *)in_stack_fffffffffffffef8);
          s = &local_78;
          SectionNode::name(in_stack_fffffffffffffef8);
          QtPrivate::asString(s);
          puVar5 = QString::utf16((QString *)
                                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          QMessageLogger::warning
                    (&local_60,"QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",
                     (ulong)in_ESI,puVar5,(ulong)(uint)pSVar2->count);
          QString::~QString((QString *)0x76ec26);
        }
        goto LAB_0076ec49;
      }
      goto LAB_0076ea08;
    }
  }
  QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
            ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,Numeric);
  if (pSVar2->count != 1) {
    QFlags<QDateTimeParser::FieldInfoFlag>::operator|=
              ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_c,FixedWidth);
  }
LAB_0076ec49:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)
         (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)local_c.i;
}

Assistant:

QDateTimeParser::FieldInfo QDateTimeParser::fieldInfo(int index) const
{
    FieldInfo ret;
    const SectionNode &sn = sectionNode(index);
    switch (sn.type) {
    case MSecSection:
        ret |= Fraction;
        Q_FALLTHROUGH();
    case SecondSection:
    case MinuteSection:
    case Hour24Section:
    case Hour12Section:
    case YearSection2Digits:
        ret |= AllowPartial;
        Q_FALLTHROUGH();
    case YearSection:
        ret |= Numeric;
        if (sn.count != 1)
            ret |= FixedWidth;
        break;
    case MonthSection:
    case DaySection:
        switch (sn.count) {
        case 2:
            ret |= FixedWidth;
            Q_FALLTHROUGH();
        case 1:
            ret |= (Numeric|AllowPartial);
            break;
        }
        break;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
        if (sn.count == 3)
            ret |= FixedWidth;
        break;
    case AmPmSection:
        // Some locales have different length AM and PM texts.
        if (getAmPmText(AmText, Case(sn.count)).size()
            == getAmPmText(PmText, Case(sn.count)).size()) {
            // Only relevant to DateTimeEdit's fixups in parse().
            ret |= FixedWidth;
        }
        break;
    case TimeZoneSection:
        break;
    default:
        qWarning("QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",
                 index, qUtf16Printable(sn.name()), sn.count);
        break;
    }
    return ret;
}